

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::PrepareCommandPool
          (DeviceContextVkImpl *this,SoftwareQueueIndex CommandQueueId)

{
  __uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
  *this_00;
  VulkanPhysicalDevice *pVVar1;
  long lVar2;
  _Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false> __p;
  HardwareQueueIndex queueFamilyIndex;
  COMMAND_QUEUE_TYPE CVar3;
  ICommandQueueVk *pIVar4;
  VulkanCommandBufferPool *this_01;
  ulong uVar5;
  ulong uVar6;
  string msg;
  string local_68;
  Char *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false> local_38;
  
  if ((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CmdQueueCount <= (ulong)CommandQueueId.m_Value) {
    FormatString<char[31]>(&local_68,(char (*) [31])"CommandQueueId is out of range");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar4 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                              m_pObject)->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  local_68._M_dataplus._M_p._0_4_ =
       (*(pIVar4->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar4);
  queueFamilyIndex.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)&local_68);
  pVVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
           m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  uVar6 = (ulong)queueFamilyIndex.m_Value;
  uVar5 = ((long)(pVVar1->m_QueueFamilyProperties).
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           *(long *)&(pVVar1->m_QueueFamilyProperties).
                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                     ._M_impl >> 3) * -0x5555555555555555;
  if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
    FormatString<char[33]>(&local_68,(char (*) [33])"QueueFamilyIndex is out of range");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"PrepareCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (__uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
             *)((this->m_QueueFamilyCmdPools)._M_t.
                super___uniq_ptr_impl<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_std::default_delete<std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>[]>_>
                .
                super__Head_base<0UL,_std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>_*,_false>
                ._M_head_impl + uVar6);
  if ((this_00->_M_t).
      super__Tuple_impl<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
      .super__Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false>._M_head_impl ==
      (VulkanCommandBufferPool *)0x0) {
    std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
              ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>
                *)&local_48,
               (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)
               (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
               m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    this_01 = (VulkanCommandBufferPool *)operator_new(0xb0);
    local_68._M_dataplus._M_p = local_48;
    local_68._M_string_length = (size_type)p_Stack_40;
    local_48 = (Char *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    VulkanUtilities::VulkanCommandBufferPool::VulkanCommandBufferPool
              (this_01,(shared_ptr<const_VulkanUtilities::VulkanLogicalDevice> *)&local_68,
               queueFamilyIndex,3);
    local_38._M_head_impl = this_01;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
    __p._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (VulkanCommandBufferPool *)0x0;
    std::
    __uniq_ptr_impl<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::reset(this_00,__p._M_head_impl);
    std::
    unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
    ::~unique_ptr((unique_ptr<VulkanUtilities::VulkanCommandBufferPool,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
                   *)&local_38);
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  this->m_CmdPool =
       (this_00->_M_t).
       super__Tuple_impl<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_std::default_delete<VulkanUtilities::VulkanCommandBufferPool>_>
       .super__Head_base<0UL,_VulkanUtilities::VulkanCommandBufferPool_*,_false>._M_head_impl;
  lVar2 = *(long *)&(pVVar1->m_QueueFamilyProperties).
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId = queueFamilyIndex.m_Value;
  CVar3 = VkQueueFlagsToCmdQueueType(*(VkQueueFlags *)(lVar2 + uVar6 * 0x18));
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueType = CVar3;
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[0] =
       *(Uint32 *)(lVar2 + 0xc + uVar6 * 0x18);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[1] =
       *(Uint32 *)(lVar2 + 0x10 + uVar6 * 0x18);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.TextureCopyGranularity[2] =
       *(Uint32 *)(lVar2 + 0x14 + uVar6 * 0x18);
  return;
}

Assistant:

void DeviceContextVkImpl::PrepareCommandPool(SoftwareQueueIndex CommandQueueId)
{
    DEV_CHECK_ERR(CommandQueueId < m_pDevice->GetCommandQueueCount(), "CommandQueueId is out of range");

    const HardwareQueueIndex QueueFamilyIndex{m_pDevice->GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    const auto&              QueueProps = m_pDevice->GetPhysicalDevice().GetQueueProperties();
    DEV_CHECK_ERR(QueueFamilyIndex < QueueProps.size(), "QueueFamilyIndex is out of range");

    std::unique_ptr<VulkanUtilities::VulkanCommandBufferPool>& Pool = m_QueueFamilyCmdPools[QueueFamilyIndex];
    if (!Pool)
    {
        // Command pools must be thread-safe because command buffers are returned into pools by release queues
        // potentially running in another thread
        Pool = std::make_unique<VulkanUtilities::VulkanCommandBufferPool>(
            m_pDevice->GetLogicalDevice().GetSharedPtr(),
            QueueFamilyIndex,
            VK_COMMAND_POOL_CREATE_TRANSIENT_BIT | VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT);
    }
    m_CmdPool = Pool.get();

    // Set queue properties
    const VkQueueFamilyProperties& QueueInfo{QueueProps[QueueFamilyIndex]};
    m_Desc.QueueId                   = static_cast<Uint8>(QueueFamilyIndex);
    m_Desc.QueueType                 = VkQueueFlagsToCmdQueueType(QueueInfo.queueFlags);
    m_Desc.TextureCopyGranularity[0] = QueueInfo.minImageTransferGranularity.width;
    m_Desc.TextureCopyGranularity[1] = QueueInfo.minImageTransferGranularity.height;
    m_Desc.TextureCopyGranularity[2] = QueueInfo.minImageTransferGranularity.depth;
}